

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  Delay3Syntax *pDVar2;
  ExpressionSyntax *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  Token *in_stack_00000040;
  ExpressionSyntax **in_stack_00000048;
  Token *in_stack_00000050;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  BumpAllocator *in_stack_ffffffffffffff58;
  ExpressionSyntax *in_stack_ffffffffffffff60;
  
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x280324);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x50))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x50))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x50))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x50))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  if (((Token *)((long)__fn + 0x60))->info != (Info *)0x0) {
    deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  pDVar2 = BumpAllocator::
           emplace<slang::syntax::Delay3Syntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (Token *)__fn,(ExpressionSyntax **)__child_stack,in_stack_00000040,
                      in_stack_00000048,in_stack_00000050);
  return (int)pDVar2;
}

Assistant:

static SyntaxNode* clone(const Delay3Syntax& node, BumpAllocator& alloc) {
    return alloc.emplace<Delay3Syntax>(
        node.hash.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.delay1, alloc),
        node.comma1.deepClone(alloc),
        node.delay2 ? deepClone(*node.delay2, alloc) : nullptr,
        node.comma2.deepClone(alloc),
        node.delay3 ? deepClone(*node.delay3, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}